

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbjava.cpp
# Opt level: O2

JniRef<_jclass_*> *
findClass(JniRef<_jclass_*> *__return_storage_ptr__,JNIEnv *env,char *name,bool createGlobalRef)

{
  jclass p_Var1;
  
  p_Var1 = (*env->functions->FindClass)(env,name);
  if (p_Var1 == (jclass)0x0) {
    checkJavaException(env);
  }
  __return_storage_ptr__->env = env;
  __return_storage_ptr__->obj = p_Var1;
  __return_storage_ptr__->global = false;
  return __return_storage_ptr__;
}

Assistant:

static JniRef<jclass> findClass(JNIEnv* env, const char* name, bool createGlobalRef)
{
	const auto localCls = env->FindClass(name);
	jclass cls = nullptr;

	if (localCls)
	{
		if (createGlobalRef)
		{
			cls = (jclass) env->NewGlobalRef(localCls);
			env->DeleteLocalRef(localCls);
		}
		else
			cls = localCls;
	}

	if (!cls)
		checkJavaException(env);

	return JniRef<jclass>(env, cls, createGlobalRef);
}